

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexOrdering.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderVertexOrdering::verifyVertexOrderingDoesNotChangeGeneratedPoints
          (TessellationShaderVertexOrdering *this,_test_iteration *test_iteration_a,
          _test_iteration *test_iteration_b)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  TestError *this_01;
  _tessellation_shader_vertex_ordering vertex_ordering_00;
  _test_iteration *extraout_RDX;
  _test_iteration *extraout_RDX_00;
  _test_iteration *extraout_RDX_01;
  _test_iteration *p_Var5;
  float fVar6;
  char *local_220;
  MessageBuilder local_218;
  undefined1 local_88 [8];
  string vertex_ordering;
  string primitive_mode;
  float *vertex_b_data;
  uint n_vertex_b;
  float *vertex_a_data;
  uint local_28;
  bool has_been_found;
  uint n_vertex_a;
  float epsilon;
  _test_iteration *test_iteration_b_local;
  _test_iteration *test_iteration_a_local;
  TessellationShaderVertexOrdering *this_local;
  
  local_28 = 0;
  p_Var5 = test_iteration_b;
  do {
    if (test_iteration_a->n_vertices <= local_28) {
      return;
    }
    bVar1 = false;
    pfVar2 = (float *)(test_iteration_a->data + (ulong)(local_28 * 3) * 4);
    for (vertex_b_data._4_4_ = 0; vertex_b_data._4_4_ < test_iteration_b->n_vertices;
        vertex_b_data._4_4_ = vertex_b_data._4_4_ + 1) {
      pfVar3 = (float *)(test_iteration_b->data + (ulong)(vertex_b_data._4_4_ * 3) * 4);
      fVar6 = de::abs<float>(*pfVar2 - *pfVar3);
      p_Var5 = extraout_RDX;
      if (fVar6 < 1e-05) {
        fVar6 = de::abs<float>(pfVar2[1] - pfVar3[1]);
        p_Var5 = extraout_RDX_00;
        if (fVar6 < 1e-05) {
          fVar6 = de::abs<float>(pfVar2[2] - pfVar3[2]);
          p_Var5 = extraout_RDX_01;
          if (fVar6 < 1e-05) {
            bVar1 = true;
            break;
          }
        }
      }
    }
    if (!bVar1) {
      TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                ((string *)((long)&vertex_ordering.field_2 + 8),
                 (TessellationShaderUtils *)(ulong)test_iteration_a->primitive_mode,
                 (_tessellation_primitive_mode)p_Var5);
      TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
                ((string *)local_88,
                 (TessellationShaderUtils *)(ulong)test_iteration_a->vertex_ordering,
                 vertex_ordering_00);
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_218,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_218,(char (*) [22])"For primitive mode: [");
      local_220 = (char *)std::__cxx11::string::c_str();
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_220);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [35])"] and inner tessellation levels: [");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,test_iteration_a->inner_tess_levels);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,test_iteration_a->inner_tess_levels + 1);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [35])"] and outer tessellation levels: [");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,test_iteration_a->outer_tess_levels);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,test_iteration_a->outer_tess_levels + 1);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,test_iteration_a->outer_tess_levels + 2);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,test_iteration_a->outer_tess_levels + 3);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a0e7f2);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [63])
                                 ", vertices generated for CW and CCW orientations do not match.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_218);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,
                 "For runs in which only vertex ordering setting differs, vertex from one run was not found in the other run."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexOrdering.cpp"
                 ,0x2db);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void TessellationShaderVertexOrdering::verifyVertexOrderingDoesNotChangeGeneratedPoints(
	const _test_iteration& test_iteration_a, const _test_iteration& test_iteration_b)
{
	const float epsilon = 1e-5f;

	/* Sanity checks */
	DE_ASSERT(test_iteration_a.is_point_mode_enabled);
	DE_ASSERT(test_iteration_b.is_point_mode_enabled);
	DE_ASSERT(test_iteration_a.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CCW ||
			  test_iteration_a.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT);
	DE_ASSERT(test_iteration_b.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CW);

	/* Iterate through all points in test set A and make sure they can be found in test set B */
	for (unsigned int n_vertex_a = 0; n_vertex_a < test_iteration_a.n_vertices; ++n_vertex_a)
	{
		bool		 has_been_found = false;
		const float* vertex_a_data  = (const float*)test_iteration_a.data + n_vertex_a * 3 /* components */;

		for (unsigned int n_vertex_b = 0; n_vertex_b < test_iteration_b.n_vertices; ++n_vertex_b)
		{
			const float* vertex_b_data = (const float*)test_iteration_b.data + n_vertex_b * 3 /* components */;

			if (de::abs(vertex_a_data[0] - vertex_b_data[0]) < epsilon &&
				de::abs(vertex_a_data[1] - vertex_b_data[1]) < epsilon &&
				de::abs(vertex_a_data[2] - vertex_b_data[2]) < epsilon)
			{
				has_been_found = true;

				break;
			}
		} /* for (all B set vertices) */

		if (!has_been_found)
		{
			std::string primitive_mode =
				TessellationShaderUtils::getESTokenForPrimitiveMode(test_iteration_a.primitive_mode);
			std::string vertex_ordering =
				TessellationShaderUtils::getESTokenForVertexOrderingMode(test_iteration_a.vertex_ordering);

			m_testCtx.getLog() << tcu::TestLog::Message << "For primitive mode: [" << primitive_mode.c_str()
							   << "] "
								  "and inner tessellation levels:"
								  " ["
							   << test_iteration_a.inner_tess_levels[0] << ", " << test_iteration_a.inner_tess_levels[1]
							   << "] "
								  "and outer tessellation levels:"
								  " ["
							   << test_iteration_a.outer_tess_levels[0] << ", " << test_iteration_a.outer_tess_levels[1]
							   << ", " << test_iteration_a.outer_tess_levels[2] << ", "
							   << test_iteration_a.outer_tess_levels[3] << "] "
							   << ", vertices generated for CW and CCW orientations do not match."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("For runs in which only vertex ordering setting differs, vertex from one run was not found in the "
					 "other run.");
		}
	} /* for (all A set vertices) */
}